

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_url_encode(char *src,size_t s_len,char *dst,size_t dst_len)

{
  ushort **ppuVar1;
  char *pcVar2;
  bool bVar3;
  long local_38;
  size_t j;
  size_t i;
  size_t dst_len_local;
  char *dst_local;
  size_t s_len_local;
  char *src_local;
  
  local_38 = 0;
  j = 0;
  while( true ) {
    bVar3 = false;
    if ((dst_len != 0) && (bVar3 = false, j < s_len)) {
      bVar3 = local_38 + 2U < dst_len - 1;
    }
    if (!bVar3) break;
    ppuVar1 = __ctype_b_loc();
    if ((((*ppuVar1)[(int)(uint)(byte)src[j]] & 8) == 0) &&
       (pcVar2 = strchr(mg_url_encode::dont_escape,(uint)(byte)src[j]), pcVar2 == (char *)0x0)) {
      if (local_38 + 3U < dst_len) {
        dst[local_38] = '%';
        dst[local_38 + 1] = mg_url_encode::hex[(int)(uint)(byte)src[j] >> 4];
        dst[local_38 + 2] = mg_url_encode::hex[(int)((byte)src[j] & 0xf)];
        local_38 = local_38 + 2;
      }
    }
    else {
      dst[local_38] = src[j];
    }
    j = j + 1;
    local_38 = local_38 + 1;
  }
  dst[local_38] = '\0';
  return (int)local_38;
}

Assistant:

int mg_url_encode(const char *src, size_t s_len, char *dst, size_t dst_len) {
  static const char *dont_escape = "._-$,;~()";
  static const char *hex = "0123456789abcdef";
  size_t i = 0, j = 0;

  for (i = j = 0; dst_len > 0 && i < s_len && j + 2 < dst_len - 1; i++, j++) {
    if (isalnum(* (const unsigned char *) (src + i)) ||
        strchr(dont_escape, * (const unsigned char *) (src + i)) != NULL) {
      dst[j] = src[i];
    } else if (j + 3 < dst_len) {
      dst[j] = '%';
      dst[j + 1] = hex[(* (const unsigned char *) (src + i)) >> 4];
      dst[j + 2] = hex[(* (const unsigned char *) (src + i)) & 0xf];
      j += 2;
    }
  }

  dst[j] = '\0';
  return j;
}